

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_name(char *p,int kind)

{
  uint8_t *__dest;
  size_t sVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  FILE *__stream;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  byte bVar15;
  byte bVar16;
  dasm_State *pdVar17;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint uVar18;
  dasm_State *__s;
  int *__s_00;
  uint uVar19;
  dasm_State *pdVar20;
  char *pcVar21;
  char *pcVar22;
  BuildCtx *ctx;
  uint *puVar23;
  BuildCtx *pBVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  uint32_t uVar28;
  uint8_t *puVar29;
  ulong uVar30;
  bool bVar31;
  int iStack_8160;
  short sStack_815c;
  char cStack_815a;
  char cStack_8159;
  undefined1 auStack_8158 [248];
  char *apcStack_8060 [4097];
  BuildCtx *pBStack_58;
  
  __s_00 = (int *)(ulong)(uint)kind;
  ctx = (BuildCtx *)p;
  iVar9 = kind;
  sVar10 = strlen(p);
  sVar1 = modnamelen;
  if (((kind != 0xc0) && (modnamelen < sVar10)) && (p[modnamelen] == '_')) {
    iVar9 = 0x11b260;
    ctx = (BuildCtx *)p;
    iVar4 = strncmp(p,modname,modnamelen);
    if (iVar4 == 0) {
      p = p + sVar1 + 1;
      sVar10 = sVar10 - (sVar1 + 1);
    }
  }
  if (sVar10 < 0x39) {
    if (optr + sVar10 + 3 < (uint8_t *)((long)&optr + 1U)) {
      __dest = optr + 1;
      puVar29 = optr + sVar10 + 1;
      puVar3 = __dest;
      *optr = (byte)kind | (byte)sVar10;
      optr = puVar3;
      memcpy(__dest,p,sVar10);
      optr = puVar29;
      return;
    }
  }
  else {
    ctx = (BuildCtx *)p;
    libdef_name_cold_2();
  }
  libdef_name_cold_1();
  pBVar24 = (BuildCtx *)*ctx->args;
  pBStack_58 = (BuildCtx *)p;
  if (pBVar24 == (BuildCtx *)0x0) {
LAB_0010c69f:
    emit_fold_cold_6();
  }
  else {
    if ((*(char *)&pBVar24->D == '-') &&
       (__stream = _stdin, *(char *)((long)&pBVar24->D + 1) == '\0')) {
LAB_0010c34c:
      fwrite("/* This is a generated file. DO NOT EDIT! */\n\n",0x2e,1,(FILE *)ctx->fp);
      fwrite("static const FoldFunc fold_func[] = {\n",0x26,1,(FILE *)ctx->fp);
      lineno = 0;
      funcidx = 0;
      nkeys = 0;
      pcVar11 = fgets((char *)&iStack_8160,0x100,__stream);
      pcVar12 = (char *)ctx;
      if (pcVar11 != (char *)0x0) {
        __s_00 = &iStack_8160;
        do {
          lineno = lineno + 1;
          if (sStack_815c == 0x444c && iStack_8160 == 0x4f464a4c) {
            pcVar12 = strchr(&cStack_815a,0x29);
            if (pcVar12 == (char *)0x0 || cStack_815a != '(') {
              if (((cStack_815a != 'X') && (cStack_815a != 'F')) ||
                 ((cStack_8159 != '(' || (pcVar12 == (char *)0x0)))) {
LAB_0010c688:
                iVar9 = (int)&cStack_815a;
                emit_fold_cold_2();
                goto LAB_0010c69a;
              }
              *pcVar12 = '\0';
              if (funcidx != 0) {
                fwrite(",\n",2,1,(FILE *)ctx->fp);
              }
              pcVar12 = "  fold_%s";
              if (cStack_815a == 'X') {
                pcVar12 = "  %s";
              }
              fprintf((FILE *)ctx->fp,pcVar12,auStack_8158);
              funcidx = funcidx + 1;
              pBVar24 = ctx;
            }
            else {
              *pcVar12 = '\0';
              apcStack_8060[0] = &cStack_8159;
              uVar5 = nexttoken(apcStack_8060,0,0);
              pBVar24 = (BuildCtx *)(ulong)uVar5;
              uVar6 = nexttoken(apcStack_8060,0,0x7f);
              iVar9 = 1;
              uVar7 = nexttoken(apcStack_8060,1,0x3ff);
              uVar2 = nkeys;
              uVar28 = funcidx;
              uVar13 = (ulong)nkeys;
              if (0xfff < uVar13) {
LAB_0010c69a:
                emit_fold_cold_4();
                goto LAB_0010c69f;
              }
              pBVar24 = (BuildCtx *)(ulong)(uVar5 << 0x11);
              uVar27 = uVar6 << 10 | uVar5 << 0x11 | uVar7;
              uVar8 = nkeys;
              if (nkeys != 0) {
                uVar19 = uVar27 & 0xffffff;
                puVar23 = foldkeys + uVar13;
                do {
                  uVar8 = (uint)uVar13;
                  uVar25 = foldkeys[uVar8 - 1] & 0xffffff;
                  if (uVar25 < uVar19) goto LAB_0010c4db;
                  if (uVar25 == uVar19) {
                    emit_fold_cold_3();
                    goto LAB_0010c688;
                  }
                  *puVar23 = foldkeys[uVar8 - 1];
                  puVar23 = puVar23 + -1;
                  uVar13 = uVar13 - 1;
                } while ((ulong)(uVar8 - 1) != 0);
                uVar8 = 0;
              }
LAB_0010c4db:
              foldkeys[uVar8] = uVar27 | uVar28 << 0x18;
              nkeys = uVar2 + 1;
            }
          }
          pcVar11 = fgets((char *)__s_00,0x100,__stream);
          pcVar12 = (char *)foldkeys;
        } while (pcVar11 != (char *)0x0);
      }
      fclose(__stream);
      fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
      uVar28 = nkeys;
      if (nkeys < 0x2000) {
        pcVar12 = "#define fold_hashkey(k)\t(lj_rol(lj_rol((k),%u)-(k),%u)%%%u)\n\n";
        uVar8 = nkeys | 1;
        do {
          __s_00 = (int *)0x0;
          do {
            iVar9 = tryhash((uint32_t *)apcStack_8060,uVar8,(uint32_t)__s_00,0);
            pBVar24 = (BuildCtx *)"#define fold_hashkey(k)\t(((((k)<<%u)-(k))<<%u)%%%u)\n\n";
            uVar28 = uVar8;
            if (iVar9 != 0) goto LAB_0010c62f;
            uVar27 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar27;
          } while (uVar27 != 0x400);
          __s_00 = (int *)0x0;
          do {
            iVar9 = tryhash((uint32_t *)apcStack_8060,uVar8,(uint32_t)__s_00,1);
            pBVar24 = (BuildCtx *)pcVar12;
            if (iVar9 != 0) goto LAB_0010c62f;
            uVar27 = (uint32_t)__s_00 + 1;
            __s_00 = (int *)(ulong)uVar27;
          } while (uVar27 != 0x400);
          uVar28 = uVar8 + 2;
          bVar31 = uVar8 < 0x1ffe;
          uVar8 = uVar28;
        } while (bVar31);
      }
      emit_fold_cold_5();
      pBVar24 = (BuildCtx *)pcVar12;
LAB_0010c62f:
      printhash(ctx,(uint32_t *)apcStack_8060,uVar28);
      fprintf((FILE *)ctx->fp,(char *)pBVar24,(ulong)__s_00 >> 5 & 0x7ffffff,
              (ulong)((uint)__s_00 & 0x1f),(ulong)uVar28);
      return;
    }
    iVar9 = 0x111aa1;
    __stream = fopen((char *)pBVar24,"r");
    if (__stream != (FILE *)0x0) goto LAB_0010c34c;
  }
  emit_fold_cold_1();
  __s = pBVar24->D;
  if (__s != (dasm_State *)0x0) {
    pcVar12 = strchr((char *)__s,0x20);
    if (pcVar12 == (char *)0x0) {
      pdVar17 = (dasm_State *)0x0;
    }
    else {
      pdVar17 = (dasm_State *)(pcVar12 + 1);
      *pcVar12 = '\0';
    }
    pBVar24->D = pdVar17;
    if (iVar9 != 0) {
      iVar9 = strncmp((char *)__s,"IRFPM_",6);
      if (iVar9 == 0) {
        pcVar11 = "FLOOR";
        pcVar12 = (char *)((long)&__s->psize + 6);
        uVar13 = 0;
        do {
          pcVar21 = pcVar12;
          iVar4 = strcmp(pcVar11,pcVar12);
          uVar8 = (uint)pcVar21;
          iVar9 = (int)pdVar17;
          if (iVar4 == 0) {
            return;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pcVar11 = irfpm_names[uVar13];
        } while (pcVar11 != (char *)0x0);
        goto LAB_0010c98c;
      }
      iVar9 = strncmp((char *)__s,"IRFL_",5);
      if (iVar9 == 0) {
        pcVar11 = "STR_LEN";
        pcVar12 = (char *)((long)&__s->psize + 5);
        uVar13 = 0;
        do {
          pcVar21 = pcVar12;
          iVar4 = strcmp(pcVar11,pcVar12);
          uVar8 = (uint)pcVar21;
          iVar9 = (int)pdVar17;
          if (iVar4 == 0) {
            return;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pcVar11 = irfield_names[uVar13];
        } while (pcVar11 != (char *)0x0);
        goto LAB_0010c98c;
      }
      iVar9 = strncmp((char *)__s,"IRCALL_",7);
      if (iVar9 == 0) {
        pcVar11 = "lj_str_cmp";
        pcVar12 = (char *)((long)&__s->psize + 7);
        uVar13 = 0;
        do {
          pcVar21 = pcVar12;
          iVar4 = strcmp(pcVar11,pcVar12);
          uVar8 = (uint)pcVar21;
          iVar9 = (int)pdVar17;
          if (iVar4 == 0) {
            return;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pcVar11 = ircall_names[uVar13];
        } while (pcVar11 != (char *)0x0);
        goto LAB_0010c98c;
      }
      uVar8 = 0x114380;
      iVar9 = strncmp((char *)__s,"IRCONV_",7);
      if (iVar9 == 0) {
        pcVar21 = "NIL";
        pcVar12 = (char *)((long)&__s->psize + 7);
        pcVar22 = (char *)0x5f;
        pcVar14 = strchr(pcVar12,0x5f);
        pcVar11 = pcVar14 + 1;
        uVar13 = 0;
        sVar10 = (long)pcVar14 - (long)pcVar12;
        do {
          bVar31 = true;
          if ((pcVar14 != (char *)0x0) &&
             (pcVar22 = pcVar12, iVar9 = strncmp(pcVar21,pcVar12,(long)pcVar14 - (long)pcVar12),
             iVar9 == 0)) {
            bVar31 = false;
            pcVar22 = pcVar11;
            iVar9 = strcmp("NIL",pcVar11);
            uVar30 = 0;
            while (iVar9 != 0) {
              uVar30 = (ulong)((int)uVar30 + 1);
              bVar31 = irt_names[uVar30] == (char *)0x0;
              if (bVar31) break;
              pcVar22 = pcVar11;
              iVar9 = strcmp(irt_names[uVar30],pcVar11);
            }
          }
          uVar8 = (uint)pcVar22;
          iVar9 = (int)sVar10;
          if (!bVar31) {
            return;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pcVar21 = irt_names[uVar13];
        } while (pcVar21 != (char *)0x0);
        goto LAB_0010c98c;
      }
      if ((byte)((char)__s->psize - 0x30U) < 10) {
        uVar27 = CONCAT31((int3)((uint)iVar9 >> 8),(char)__s->psize);
        iVar9 = uVar27 - 0x30;
        bVar15 = (byte)iVar9;
        while (bVar15 < 10) {
          bVar15 = *(byte *)((long)&__s->psize + 1);
          uVar27 = (uint)bVar15;
          __s = (dasm_State *)((long)&__s->psize + 1);
          iVar9 = bVar15 - 0x30;
          bVar15 = (byte)iVar9;
        }
        if ((char)uVar27 == '\0') {
          return;
        }
        goto LAB_0010c98c;
      }
    }
    if ((extraout_EDX == 0) || (iVar9 = strcmp("any",(char *)__s), iVar9 != 0)) {
      pcVar12 = "LT";
      uVar13 = 0;
      do {
        pdVar20 = __s;
        iVar4 = strcmp(pcVar12,(char *)__s);
        uVar8 = (uint)pdVar20;
        iVar9 = (int)pdVar17;
        if (iVar4 == 0) {
          return;
        }
        uVar13 = (ulong)((int)uVar13 + 1);
        pcVar12 = ir_names[uVar13];
      } while (pcVar12 != (char *)0x0);
LAB_0010c98c:
      nexttoken_cold_1();
      if ((iVar9 == 0) || (0x1f < extraout_EDX_00 && (extraout_EDX_00 & 0x1f) != 0)) {
        memset(__s,0xff,(ulong)uVar8 * 4 + 4);
        uVar13 = (ulong)nkeys;
        if (uVar13 != 0) {
          bVar15 = (byte)extraout_EDX_00;
          lVar26 = 0;
          do {
            uVar27 = *(uint *)((long)foldkeys + lVar26);
            uVar19 = uVar27 & 0xffffff;
            bVar16 = (byte)(extraout_EDX_00 >> 5);
            if (iVar9 == 0) {
              uVar19 = (uVar19 << (bVar16 & 0x1f)) - uVar19 << (bVar15 & 0x1f);
            }
            else {
              uVar19 = (uVar19 << (bVar16 & 0x1f) | uVar19 >> 0x20 - (bVar16 & 0x1f)) - uVar19;
              uVar19 = uVar19 << (bVar15 & 0x1f) | uVar19 >> 0x20 - (bVar15 & 0x1f);
            }
            uVar30 = (ulong)uVar19 % (ulong)uVar8;
            if (*(int *)((long)&((dasm_State *)(__s->sections + -2))->psize + uVar30 * 4) == -1) {
              puVar23 = (uint *)((long)&((dasm_State *)(__s->sections + -2))->psize + uVar30 * 4);
            }
            else {
              uVar25 = (uint)uVar30;
              puVar23 = (uint *)((long)__s->sections + uVar30 * 4 + -0x4c);
              uVar19 = *puVar23;
              if (uVar19 != 0xffffffff) {
                if (uVar8 - 1 <= uVar25) {
                  return;
                }
                if (*(int *)((long)__s->sections + (long)(int)uVar25 * 4 + -0x48) != -1) {
                  return;
                }
                uVar18 = uVar19 & 0xffffff;
                if (iVar9 == 0) {
                  uVar18 = (uVar18 << (bVar16 & 0x1f)) - uVar18 << (bVar15 & 0x1f);
                }
                else {
                  uVar18 = (uVar18 << (bVar16 & 0x1f) | uVar18 >> 0x20 - (bVar16 & 0x1f)) - uVar18;
                  uVar18 = uVar18 << (bVar15 & 0x1f) | uVar18 >> 0x20 - (bVar15 & 0x1f);
                }
                if (uVar18 % uVar8 != uVar25 + 1) {
                  return;
                }
                *(uint *)((long)__s->sections + (long)(int)uVar25 * 4 + -0x48) = uVar19;
              }
            }
            *puVar23 = uVar27;
            lVar26 = lVar26 + 4;
          } while (uVar13 << 2 != lVar26);
        }
      }
      return;
    }
  }
  return;
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}